

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTable.h
# Opt level: O2

void __thiscall SGParser::ParseTable::~ParseTable(ParseTable *this)

{
  Destroy(this);
  std::
  _Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
  ::~_Vector_base(&(this->ReduceProductions).
                   super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                 );
  std::_Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>::~_Vector_base
            (&(this->GotoTable).
              super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>);
  std::_Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>::~_Vector_base
            (&(this->ActionTable).
              super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->ProductionErrorTerminals)._M_h);
  std::
  _Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>::
  ~_Vector_base(&(this->StateInfos).
                 super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
               );
  std::_Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
  ::~_Vector_base(&(this->Terminals).
                   super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
                 );
  std::
  _Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
  ::~_Vector_base((_Vector_base<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
                   *)this);
  return;
}

Assistant:

~ParseTable() { Destroy(); }